

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreXmlSerializer.cpp
# Opt level: O0

bool Assimp::Ogre::OgreXmlSerializer::ImportSkeleton(IOSystem *pIOHandler,MeshXml *mesh)

{
  MeshXml *s;
  bool bVar1;
  ulong uVar2;
  element_type *peVar3;
  Skeleton *this;
  undefined1 local_c0 [8];
  OgreXmlSerializer serializer;
  Skeleton *skeleton;
  undefined1 local_88 [8];
  XmlReaderPtr reader;
  allocator<char> local_41;
  string local_40;
  MeshXml *local_20;
  MeshXml *mesh_local;
  IOSystem *pIOHandler_local;
  
  if ((mesh == (MeshXml *)0x0) ||
     (local_20 = mesh, mesh_local = (MeshXml *)pIOHandler, uVar2 = std::__cxx11::string::empty(),
     s = local_20, (uVar2 & 1) != 0)) {
    pIOHandler_local._7_1_ = 0;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,".skeleton",&local_41);
    bVar1 = EndsWith(&s->skeletonRef,&local_40,false);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    if (bVar1) {
      bVar1 = OgreBinarySerializer::ImportSkeleton((IOSystem *)mesh_local,local_20);
      if (bVar1) {
        pIOHandler_local._7_1_ = 1;
        goto LAB_0078287e;
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &reader.
                      super___shared_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount,&local_20->skeletonRef,".xml");
      std::__cxx11::string::operator=
                ((string *)local_20,
                 (string *)
                 &reader.
                  super___shared_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      std::__cxx11::string::~string
                ((string *)
                 &reader.
                  super___shared_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
    }
    OpenReader((OgreXmlSerializer *)local_88,(IOSystem *)mesh_local,&local_20->skeletonRef);
    peVar3 = std::
             __shared_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2>
             ::get((__shared_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2>
                    *)local_88);
    if (peVar3 == (element_type *)0x0) {
      pIOHandler_local._7_1_ = 0;
    }
    else {
      this = (Skeleton *)operator_new(0x38);
      Skeleton::Skeleton(this);
      serializer.m_currentNodeName.field_2._8_8_ = this;
      peVar3 = std::
               __shared_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2>
               ::get((__shared_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2>
                      *)local_88);
      OgreXmlSerializer((OgreXmlSerializer *)local_c0,peVar3);
      ReadSkeleton((OgreXmlSerializer *)local_c0,
                   (Skeleton *)serializer.m_currentNodeName.field_2._8_8_);
      local_20->skeleton = (Skeleton *)serializer.m_currentNodeName.field_2._8_8_;
      pIOHandler_local._7_1_ = 1;
      ~OgreXmlSerializer((OgreXmlSerializer *)local_c0);
    }
    std::shared_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>_>::~shared_ptr
              ((shared_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>_> *)local_88);
  }
LAB_0078287e:
  return (bool)(pIOHandler_local._7_1_ & 1);
}

Assistant:

bool OgreXmlSerializer::ImportSkeleton(Assimp::IOSystem *pIOHandler, MeshXml *mesh)
{
    if (!mesh || mesh->skeletonRef.empty())
        return false;

    // Highly unusual to see in read world cases but support
    // XML mesh referencing a binary skeleton file.
    if (EndsWith(mesh->skeletonRef, ".skeleton", false))
    {
        if (OgreBinarySerializer::ImportSkeleton(pIOHandler, mesh))
            return true;

        /** Last fallback if .skeleton failed to be read. Try reading from
            .skeleton.xml even if the XML file referenced a binary skeleton.
            @note This logic was in the previous version and I don't want to break
            old code that might depends on it. */
        mesh->skeletonRef = mesh->skeletonRef + ".xml";
    }

    XmlReaderPtr reader = OpenReader(pIOHandler, mesh->skeletonRef);
    if (!reader.get())
        return false;

    Skeleton *skeleton = new Skeleton();
    OgreXmlSerializer serializer(reader.get());
    serializer.ReadSkeleton(skeleton);
    mesh->skeleton = skeleton;
    return true;
}